

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_apply_interpolation.h
# Opt level: O0

void ncnn::gridsample_3d_bilinear_apply_interpolation_p1
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  float *pfVar5;
  undefined8 *in_RDX;
  long *in_RSI;
  long lVar6;
  long *in_RDI;
  float v1;
  float v0;
  float v11;
  float v10;
  float v01;
  float v00;
  float v111;
  float v110;
  float v101;
  float v100;
  float v011;
  float v010;
  float v001;
  float v000;
  float *value_ptr;
  int *offset_ptr;
  int x;
  float *offset_value_ptr;
  float *dstptr;
  float *srcptr;
  int q;
  int grid_size;
  int outd;
  int outh;
  int outw;
  int channels;
  Mat *m_2;
  Mat *m;
  Mat *m_1;
  float local_408;
  float local_404;
  float local_400;
  float local_3fc;
  float local_3f8;
  float local_3f4;
  float local_3f0;
  float local_3ec;
  int local_324;
  int *local_2d8;
  float *local_288;
  int local_230;
  
  lVar3 = in_RSI[7];
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar4 = in_RSI[6];
  iVar2 = *(int *)((long)in_RSI + 0x34);
  for (local_230 = 0; local_230 < (int)lVar3; local_230 = local_230 + 1) {
    lVar6 = *in_RDI + in_RDI[8] * (long)local_230 * in_RDI[2];
    local_288 = (float *)(*in_RSI + in_RSI[8] * (long)local_230 * in_RSI[2]);
    local_2d8 = (int *)*in_RDX;
    for (local_324 = 0; local_324 < iVar1 * (int)lVar4 * iVar2; local_324 = local_324 + 1) {
      pfVar5 = (float *)(local_2d8 + 8);
      if (*local_2d8 < 0) {
        local_3ec = 0.0;
      }
      else {
        local_3ec = *(float *)(lVar6 + (long)*local_2d8 * 4);
      }
      if (local_2d8[1] < 0) {
        local_3f0 = 0.0;
      }
      else {
        local_3f0 = *(float *)(lVar6 + (long)local_2d8[1] * 4);
      }
      if (local_2d8[2] < 0) {
        local_3f4 = 0.0;
      }
      else {
        local_3f4 = *(float *)(lVar6 + (long)local_2d8[2] * 4);
      }
      if (local_2d8[3] < 0) {
        local_3f8 = 0.0;
      }
      else {
        local_3f8 = *(float *)(lVar6 + (long)local_2d8[3] * 4);
      }
      if (local_2d8[4] < 0) {
        local_3fc = 0.0;
      }
      else {
        local_3fc = *(float *)(lVar6 + (long)local_2d8[4] * 4);
      }
      if (local_2d8[5] < 0) {
        local_400 = 0.0;
      }
      else {
        local_400 = *(float *)(lVar6 + (long)local_2d8[5] * 4);
      }
      if (local_2d8[6] < 0) {
        local_404 = 0.0;
      }
      else {
        local_404 = *(float *)(lVar6 + (long)local_2d8[6] * 4);
      }
      if (local_2d8[7] < 0) {
        local_408 = 0.0;
      }
      else {
        local_408 = *(float *)(lVar6 + (long)local_2d8[7] * 4);
      }
      *local_288 = ((local_3ec * (1.0 - *pfVar5) + local_3f0 * *pfVar5) *
                    (1.0 - (float)local_2d8[9]) +
                   (local_3f4 * (1.0 - *pfVar5) + local_3f8 * *pfVar5) * (float)local_2d8[9]) *
                   (1.0 - (float)local_2d8[10]) +
                   ((local_3fc * (1.0 - *pfVar5) + local_400 * *pfVar5) *
                    (1.0 - (float)local_2d8[9]) +
                   (local_404 * (1.0 - *pfVar5) + local_408 * *pfVar5) * (float)local_2d8[9]) *
                   (float)local_2d8[10];
      local_288 = local_288 + 1;
      local_2d8 = local_2d8 + 0xb;
    }
  }
  return;
}

Assistant:

static void gridsample_3d_bilinear_apply_interpolation_p1(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int outd = dst.d;
    const int grid_size = outw * outh * outd;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const float* offset_value_ptr = offset_value.channel(0);

        for (int x = 0; x < grid_size; x++)
        {
            const int* offset_ptr = (int*)offset_value_ptr;
            const float* value_ptr = offset_value_ptr + 8;

            float v000 = offset_ptr[0] >= 0 ? *(srcptr + offset_ptr[0]) : 0;
            float v001 = offset_ptr[1] >= 0 ? *(srcptr + offset_ptr[1]) : 0;
            float v010 = offset_ptr[2] >= 0 ? *(srcptr + offset_ptr[2]) : 0;
            float v011 = offset_ptr[3] >= 0 ? *(srcptr + offset_ptr[3]) : 0;

            float v100 = offset_ptr[4] >= 0 ? *(srcptr + offset_ptr[4]) : 0;
            float v101 = offset_ptr[5] >= 0 ? *(srcptr + offset_ptr[5]) : 0;
            float v110 = offset_ptr[6] >= 0 ? *(srcptr + offset_ptr[6]) : 0;
            float v111 = offset_ptr[7] >= 0 ? *(srcptr + offset_ptr[7]) : 0;

            float v00 = v000 * (1 - value_ptr[0]) + v001 * value_ptr[0];
            float v01 = v010 * (1 - value_ptr[0]) + v011 * value_ptr[0];
            float v10 = v100 * (1 - value_ptr[0]) + v101 * value_ptr[0];
            float v11 = v110 * (1 - value_ptr[0]) + v111 * value_ptr[0];

            float v0 = v00 * (1 - value_ptr[1]) + v01 * value_ptr[1];
            float v1 = v10 * (1 - value_ptr[1]) + v11 * value_ptr[1];

            *dstptr = v0 * (1 - value_ptr[2]) + v1 * value_ptr[2];

            dstptr++;
            offset_value_ptr += 11;
        }
    }
}